

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

WindowSurfacePair
eglu::anon_unknown_1::createWindow
          (NativeDisplay *nativeDisplay,NativeWindowFactory *windowFactory,EGLDisplay eglDisplay,
          EGLConfig eglConfig,RenderConfig *config)

{
  RenderConfig *pRVar1;
  EGLConfig pvVar2;
  EGLDisplay pvVar3;
  NativeWindowFactory *pNVar4;
  int local_8c;
  Visibility local_88;
  WindowParams local_74;
  EGLAttrib local_68;
  EGLAttrib attribList [1];
  EGLSurface surface;
  NativeWindow *nativeWindow;
  int local_48;
  Visibility visibility;
  int height;
  int width;
  RenderConfig *config_local;
  EGLConfig eglConfig_local;
  EGLDisplay eglDisplay_local;
  NativeWindowFactory *windowFactory_local;
  NativeDisplay *nativeDisplay_local;
  
  if (config->width == -1) {
    local_88 = ~VISIBILITY_HIDDEN;
  }
  else {
    local_88 = config->width;
  }
  visibility = local_88;
  if (config->height == -1) {
    local_8c = -1;
  }
  else {
    local_8c = config->height;
  }
  local_48 = local_8c;
  _height = config;
  config_local = (RenderConfig *)eglConfig;
  eglConfig_local = eglDisplay;
  eglDisplay_local = windowFactory;
  windowFactory_local = (NativeWindowFactory *)nativeDisplay;
  nativeWindow._4_4_ = getNativeWindowVisibility(config->windowVisibility);
  pNVar4 = windowFactory_local;
  pvVar3 = eglDisplay_local;
  pvVar2 = eglConfig_local;
  pRVar1 = config_local;
  surface = (EGLSurface)0x0;
  attribList[0] = 0;
  local_68 = 0x3038;
  WindowParams::WindowParams(&local_74,visibility,local_48,nativeWindow._4_4_);
  surface = (EGLSurface)
            (**(code **)(*pvVar3 + 0x20))(pvVar3,pNVar4,pvVar2,pRVar1,&local_68,&local_74);
  attribList[0] =
       (EGLAttrib)
       createWindowSurface((NativeDisplay *)windowFactory_local,(NativeWindow *)surface,
                           eglConfig_local,config_local,&local_68);
  std::pair<eglu::NativeWindow_*,_void_*>::pair<eglu::NativeWindow_*&,_void_*&,_true>
            ((pair<eglu::NativeWindow_*,_void_*> *)&nativeDisplay_local,(NativeWindow **)&surface,
             (void **)attribList);
  return _nativeDisplay_local;
}

Assistant:

WindowSurfacePair createWindow (NativeDisplay* nativeDisplay, const NativeWindowFactory* windowFactory, EGLDisplay eglDisplay, EGLConfig eglConfig, const glu::RenderConfig& config)
{
	const int						width			= (config.width		== glu::RenderConfig::DONT_CARE ? WindowParams::SIZE_DONT_CARE	: config.width);
	const int						height			= (config.height	== glu::RenderConfig::DONT_CARE ? WindowParams::SIZE_DONT_CARE	: config.height);
	const WindowParams::Visibility	visibility		= getNativeWindowVisibility(config.windowVisibility);
	NativeWindow*					nativeWindow	= DE_NULL;
	EGLSurface						surface			= EGL_NO_SURFACE;
	const EGLAttrib					attribList[]	= { EGL_NONE };

	nativeWindow = windowFactory->createWindow(nativeDisplay, eglDisplay, eglConfig, &attribList[0], WindowParams(width, height, visibility));

	try
	{
		surface = eglu::createWindowSurface(*nativeDisplay, *nativeWindow, eglDisplay, eglConfig, attribList);
	}
	catch (...)
	{
		delete nativeWindow;
		throw;
	}

	return WindowSurfacePair(nativeWindow, surface);
}